

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateMachinePattern.cpp
# Opt level: O0

void __thiscall State3::executeStateTask(State3 *this)

{
  size_t sVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  reference pvVar5;
  shared_ptr<Status> *this_00;
  allocator<char> local_a1;
  string local_a0;
  bool local_79;
  size_t local_78;
  size_t nRsandNum;
  string local_68;
  allocator<char> local_31;
  value_type local_30;
  State3 *local_10;
  State3 *this_local;
  
  local_10 = this;
  peVar3 = std::__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_State).spData);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"State 3 was here",&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&peVar3->vGuestBook,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  peVar4 = std::__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_State).spStatus);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"STM: Executing state 3",(allocator<char> *)((long)&nRsandNum + 7))
  ;
  Status::setStatusMessage(peVar4,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&nRsandNum + 7));
  iVar2 = rand();
  while( true ) {
    local_78 = (size_t)(iVar2 % 4 + 1);
    peVar3 = std::__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &(this->super_State).spData);
    sVar1 = local_78;
    if (peVar3->nPreviousRandomNumber != local_78) break;
    iVar2 = rand();
  }
  peVar3 = std::__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_State).spData);
  peVar3->nPreviousRandomNumber = sVar1;
  if (local_78 == 4) {
    this_00 = &(this->super_State).spStatus;
    peVar4 = std::__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        this_00);
    local_79 = false;
    Status::setStatus(peVar4,&local_79);
    peVar4 = std::__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"STM ERROR: Transition from state 3 to State 4 is forbidden!",
               &local_a1);
    Status::setStatusMessage(peVar4,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    peVar3 = std::__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &(this->super_State).spData);
    peVar3->bChangeState = false;
    pvVar5 = std::vector<std::shared_ptr<State>,_std::allocator<std::shared_ptr<State>_>_>::
             operator[](&(this->super_State).spPossibleNextStates,1);
    std::shared_ptr<State>::operator=(&(this->super_State).spNextState,pvVar5);
  }
  else {
    pvVar5 = std::vector<std::shared_ptr<State>,_std::allocator<std::shared_ptr<State>_>_>::
             operator[](&(this->super_State).spPossibleNextStates,local_78 - 1);
    std::shared_ptr<State>::operator=(&(this->super_State).spNextState,pvVar5);
  }
  return;
}

Assistant:

void State3::executeStateTask()
{
    spData->vGuestBook.push_back( "State 3 was here" );
    spStatus->setStatusMessage("STM: Executing state 3");
    
    size_t nRsandNum = ( rand() % 4 ) + 1;

    while(spData->nPreviousRandomNumber == nRsandNum)
    {
        nRsandNum = ( rand() % 4 ) + 1;
    }
     
    spData->nPreviousRandomNumber = nRsandNum;
    
    if(nRsandNum == 4)
    {
        spStatus->setStatus(false);
        spStatus->setStatusMessage("STM ERROR: Transition from state 3 to State 4 is forbidden!");
        spData->bChangeState = false;
        spNextState = spPossibleNextStates[1];
    }
    else
    {
        spNextState = spPossibleNextStates[nRsandNum-1];
    }
    
}